

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GibbsSamplerFromHDP.cpp
# Opt level: O0

void __thiscall GibbsSamplerFromHDP::initializeParameters(GibbsSamplerFromHDP *this)

{
  uint uVar1;
  uint uVar2;
  const_reference pvVar3;
  const_iterator __first;
  const_iterator __last;
  reference pvVar4;
  const_reference pvVar5;
  ulong uVar6;
  allocator<std::vector<double,_std::allocator<double>_>_> local_25a;
  allocator<double> local_259;
  value_type_conflict1 local_258;
  vector<double,_std::allocator<double>_> local_250;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_238;
  allocator<std::vector<double,_std::allocator<double>_>_> local_21a;
  allocator<double> local_219;
  value_type_conflict1 local_218;
  vector<double,_std::allocator<double>_> local_210;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_1f8;
  allocator<double> local_1d9;
  value_type_conflict1 local_1d8;
  vector<double,_std::allocator<double>_> local_1d0;
  allocator<unsigned_int> local_1b5;
  uint local_1b4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1b0;
  allocator<unsigned_int> local_195;
  uint local_194;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_190;
  uint local_178;
  uint local_174;
  int j_4;
  uint nSum;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_168;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_150;
  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  local_138;
  allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_11e;
  allocator<unsigned_int> local_11d;
  value_type_conflict local_11c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_118;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_100;
  allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_e6;
  allocator<unsigned_int> local_e5;
  value_type_conflict local_e4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_e0;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_c8;
  allocator<unsigned_int> local_ad;
  value_type_conflict local_ac;
  undefined1 local_a8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> bufVector_2;
  int j_3;
  uint initialTNumber;
  undefined1 local_80 [4];
  int i_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> bufVector_1;
  int j_2;
  uint local_54;
  uint local_50;
  uint local_4c;
  int i;
  int v;
  vector<unsigned_int,_std::allocator<unsigned_int>_> bufVector;
  int j_1;
  uint local_18;
  value_type_conflict local_14;
  int j;
  GibbsSamplerFromHDP *this_local;
  
  local_14 = 1;
  _j = this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::assign
            (&this->_Tj,(ulong)this->_J,&local_14);
  for (local_18 = 0; local_18 < this->_J; local_18 = local_18 + 1) {
    pvVar3 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[](this->_frequencyMatrix,(long)(int)local_18);
    __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar3);
    pvVar3 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[](this->_frequencyMatrix,(long)(int)local_18);
    __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar3);
    uVar2 = std::
            accumulate<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                      ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        )__first._M_current,
                       (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        )__last._M_current,0);
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->_nj,(long)(int)local_18);
    *pvVar4 = uVar2;
  }
  for (bufVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      bufVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < this->_J;
      bufVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           bufVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
    for (local_4c = 0; local_4c < this->_V; local_4c = local_4c + 1) {
      local_50 = 0;
      while( true ) {
        uVar2 = local_50;
        pvVar3 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[](this->_frequencyMatrix,
                              (long)(int)bufVector.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (pvVar3,(long)(int)local_4c);
        if (*pvVar5 <= uVar2) break;
        local_54 = local_4c;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,&local_54);
        local_50 = local_50 + 1;
      }
    }
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::push_back(&this->_xji,(value_type *)&i);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
  }
  for (bufVector_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      (uint)bufVector_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage < this->_J;
      bufVector_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           (uint)bufVector_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage + 1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
    initialTNumber = 0;
    while( true ) {
      uVar2 = initialTNumber;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->_nj,
                          (long)(int)(uint)bufVector_1.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (*pvVar4 <= uVar2) break;
      j_3 = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,
                 (value_type_conflict *)&j_3);
      initialTNumber = initialTNumber + 1;
    }
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::push_back(&this->_tji,(value_type *)local_80);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
  }
  bufVector_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  for (bufVector_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      (uint)bufVector_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage < this->_J;
      bufVector_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           (uint)bufVector_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage + 1) {
    uVar6 = (ulong)bufVector_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    local_ac = 0;
    std::allocator<unsigned_int>::allocator(&local_ad);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8,uVar6,&local_ac,
               &local_ad);
    std::allocator<unsigned_int>::~allocator(&local_ad);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::push_back(&this->_kjt,(value_type *)local_a8);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::push_back(&this->_njt,(value_type *)local_a8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8);
  }
  uVar2 = this->_V;
  uVar1 = this->_K;
  local_e4 = 0;
  std::allocator<unsigned_int>::allocator(&local_e5);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_e0,(ulong)uVar2,&local_e4,&local_e5);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator(&local_e6);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&local_c8,(ulong)uVar1,&local_e0,&local_e6);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::operator=(&this->_nkv,&local_c8);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_c8);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator(&local_e6);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_e0);
  std::allocator<unsigned_int>::~allocator(&local_e5);
  uVar2 = this->_V;
  uVar1 = this->_K;
  local_11c = 0;
  std::allocator<unsigned_int>::allocator(&local_11d);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_118,(ulong)uVar2,&local_11c,&local_11d);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator(&local_11e);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&local_100,(ulong)uVar1,&local_118,&local_11e);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::operator=(&this->_nkv,&local_100);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_100);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator(&local_11e);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_118);
  std::allocator<unsigned_int>::~allocator(&local_11d);
  uVar2 = this->_J;
  uVar1 = this->_V;
  uVar6 = (ulong)bufVector_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage._4_4_;
  nSum = 0;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&j_4 + 3));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_168,(ulong)uVar1,&nSum,(allocator<unsigned_int> *)((long)&j_4 + 3));
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
             ((long)&j_4 + 2));
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&local_150,uVar6,&local_168,
           (allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)((long)&j_4 + 2))
  ;
  std::
  allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::allocator((allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
               *)((long)&j_4 + 1));
  std::
  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ::vector(&local_138,(ulong)uVar2,&local_150,
           (allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
            *)((long)&j_4 + 1));
  std::
  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ::operator=(&this->_njtv,&local_138);
  std::
  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ::~vector(&local_138);
  std::
  allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::~allocator((allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                *)((long)&j_4 + 1));
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_150);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
             ((long)&j_4 + 2));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_168);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&j_4 + 3));
  local_174 = 0;
  for (local_178 = 0; local_178 < this->_J; local_178 = local_178 + 1) {
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->_nj,(long)(int)local_178);
    local_174 = *pvVar4 + local_174;
  }
  uVar2 = this->_K;
  local_194 = local_174 / uVar2;
  std::allocator<unsigned_int>::allocator(&local_195);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_190,(ulong)uVar2,&local_194,&local_195);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&this->_nk,&local_190);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_190);
  std::allocator<unsigned_int>::~allocator(&local_195);
  uVar2 = this->_K;
  local_1b4 = this->_J / uVar2;
  std::allocator<unsigned_int>::allocator(&local_1b5);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_1b0,(ulong)uVar2,&local_1b4,&local_1b5);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&this->_mk,&local_1b0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_1b0);
  std::allocator<unsigned_int>::~allocator(&local_1b5);
  uVar2 = this->_K;
  local_1d8 = 0.0;
  std::allocator<double>::allocator(&local_1d9);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_1d0,(ulong)uVar2,&local_1d8,&local_1d9);
  std::vector<double,_std::allocator<double>_>::operator=(&this->_sumOfNkSampled,&local_1d0);
  std::vector<double,_std::allocator<double>_>::~vector(&local_1d0);
  std::allocator<double>::~allocator(&local_1d9);
  uVar2 = this->_J;
  uVar1 = this->_K;
  local_218 = 0.0;
  std::allocator<double>::allocator(&local_219);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_210,(ulong)uVar1,&local_218,&local_219);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator(&local_21a);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_1f8,(ulong)uVar2,&local_210,&local_21a);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=(&this->_sumOfNjkSampled,&local_1f8);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_1f8);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator(&local_21a);
  std::vector<double,_std::allocator<double>_>::~vector(&local_210);
  std::allocator<double>::~allocator(&local_219);
  uVar2 = this->_V;
  uVar1 = this->_K;
  local_258 = 0.0;
  std::allocator<double>::allocator(&local_259);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_250,(ulong)uVar2,&local_258,&local_259);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator(&local_25a);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_238,(ulong)uVar1,&local_250,&local_25a);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=(&this->_sumOfNkvSampled,&local_238);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_238);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator(&local_25a);
  std::vector<double,_std::allocator<double>_>::~vector(&local_250);
  std::allocator<double>::~allocator(&local_259);
  return;
}

Assistant:

void GibbsSamplerFromHDP::initializeParameters(){//{{{
    _Tj.assign(_J, 1);
    for(int j=0; j<_J; j++){
        _nj[j] = accumulate(_frequencyMatrix[j].begin(), _frequencyMatrix[j].end(), 0u);
    }
    // initialize xji with frequencyMatrix
    for(int j=0; j<_J; j++){
        vector<unsigned int> bufVector;
        for(int v=0; v<_V; v++){
            for(int i=0; i<_frequencyMatrix[j][v]; i++){
                bufVector.push_back(v);
            }
        }
        _xji.push_back(bufVector);
    }
    for(int j=0; j<_J; j++){
        vector<unsigned int> bufVector;
        for(int i=0; i<_nj[j]; i++){
            bufVector.push_back(0);
        }
        _tji.push_back(bufVector);
    }
    unsigned int initialTNumber = 1;
    for(int j=0; j<_J; j++){
        vector<unsigned int> bufVector(initialTNumber, 0);
        _kjt.push_back(bufVector);
        _njt.push_back(bufVector);
    }
    _nkv = vector<vector<unsigned int> >(_K, vector<unsigned int>(_V, 0));
    _nkv = vector<vector<unsigned int> >(_K, vector<unsigned int>(_V, 0));
    _njtv = vector<vector<vector<unsigned int> > >(_J, vector<vector<unsigned int> >(initialTNumber, vector<unsigned int>(_V, 0)));
    unsigned int nSum = 0;
    for(int j=0; j<_J; j++){
        nSum += _nj[j];
    }
    _nk = vector<unsigned int>(_K, nSum/_K);
    _mk = vector<unsigned int>(_K, _J * 1 / _K);
    _sumOfNkSampled = vector<double>(_K, 0);
    _sumOfNjkSampled = vector<vector<double> >(_J, vector<double>(_K, 0));
    _sumOfNkvSampled = vector<vector<double> >(_K, vector<double>(_V, 0));
}